

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O0

ExprP<int> __thiscall vkt::shaderexecutor::VariableP::operator_cast_to_ExprP(VariableP *this)

{
  SharedPtrStateBase *extraout_RDX;
  ExprP<int> EVar1;
  SharedPtr<const_vkt::shaderexecutor::Expr<int>_> local_28;
  VariableP<int> *this_local;
  
  this_local = (VariableP<int> *)this;
  de::SharedPtr::operator_cast_to_SharedPtr((SharedPtr *)&local_28);
  exprP<int>((shaderexecutor *)this,&local_28);
  de::SharedPtr<const_vkt::shaderexecutor::Expr<int>_>::~SharedPtr(&local_28);
  EVar1.super_ExprPBase<int>.super_SharedPtr<const_vkt::shaderexecutor::Expr<int>_>.m_state =
       extraout_RDX;
  EVar1.super_ExprPBase<int>.super_SharedPtr<const_vkt::shaderexecutor::Expr<int>_>.m_ptr =
       (Expr<int> *)this;
  return (ExprP<int>)
         EVar1.super_ExprPBase<int>.super_SharedPtr<const_vkt::shaderexecutor::Expr<int>_>;
}

Assistant:

operator	ExprP<T>	(void) const { return exprP(SharedPtr<const Expr<T> >(*this)); }